

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsontz.cpp
# Opt level: O0

int32_t __thiscall
icu_63::OlsonTimeZone::getOffset
          (OlsonTimeZone *this,uint8_t era,int32_t year,int32_t month,int32_t dom,uint8_t dow,
          int32_t millis,UErrorCode *ec)

{
  UBool UVar1;
  int8_t iVar2;
  uint8_t dow_local;
  int32_t dom_local;
  int32_t month_local;
  int32_t year_local;
  uint8_t era_local;
  OlsonTimeZone *this_local;
  
  if ((month < 0) || (0xb < month)) {
    UVar1 = ::U_SUCCESS(*ec);
    if (UVar1 != '\0') {
      *ec = U_ILLEGAL_ARGUMENT_ERROR;
    }
    this_local._4_4_ = 0;
  }
  else {
    iVar2 = Grego::monthLength(year,month);
    this_local._4_4_ =
         (*(this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[5])
                   (this,(ulong)era,(ulong)(uint)year,(ulong)(uint)month,(ulong)(uint)dom,(ulong)dow
                    ,millis,(int)iVar2,ec);
  }
  return this_local._4_4_;
}

Assistant:

int32_t OlsonTimeZone::getOffset(uint8_t era, int32_t year, int32_t month,
                                 int32_t dom, uint8_t dow,
                                 int32_t millis, UErrorCode& ec) const {
    if (month < UCAL_JANUARY || month > UCAL_DECEMBER) {
        if (U_SUCCESS(ec)) {
            ec = U_ILLEGAL_ARGUMENT_ERROR;
        }
        return 0;
    } else {
        return getOffset(era, year, month, dom, dow, millis,
                         Grego::monthLength(year, month),
                         ec);
    }
}